

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

string * __thiscall
vkt::synchronization::(anonymous_namespace)::getShaderImageType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat format,
          VkImageType imageType)

{
  TextureChannelClass TVar1;
  char *local_78;
  allocator<char> local_59;
  undefined4 local_58;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string formatPart;
  TextureFormat texFormat;
  VkImageType imageType_local;
  VkFormat format_local;
  
  formatPart.field_2._8_8_ = ::vk::mapVkFormat((VkFormat)this);
  TVar1 = tcu::getTextureChannelClass(formatPart.field_2._12_4_);
  if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_78 = "u";
  }
  else {
    TVar1 = tcu::getTextureChannelClass(formatPart.field_2._12_4_);
    local_78 = "";
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      local_78 = "i";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,local_78,&local_41);
  std::allocator<char>::~allocator(&local_41);
  if (format == VK_FORMAT_UNDEFINED) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "image1D");
  }
  else if (format == VK_FORMAT_R4G4_UNORM_PACK8) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "image2D");
  }
  else if (format == VK_FORMAT_R4G4B4A4_UNORM_PACK16) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "image3D");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)0x0,&local_59);
    std::allocator<char>::~allocator(&local_59);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageType (const VkFormat format, const VkImageType imageType)
{
	const tcu::TextureFormat	texFormat	= mapVkFormat(format);
	const std::string			formatPart	= tcu::getTextureChannelClass(texFormat.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER ? "u" :
											  tcu::getTextureChannelClass(texFormat.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER   ? "i" : "";
	switch (imageType)
	{
		case VK_IMAGE_TYPE_1D:	return formatPart + "image1D";
		case VK_IMAGE_TYPE_2D:	return formatPart + "image2D";
		case VK_IMAGE_TYPE_3D:	return formatPart + "image3D";

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}